

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O1

unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> * __thiscall
pstack::Dwarf::Unit::getLines(Unit *this)

{
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *this_00;
  Info *offset;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> __p;
  Tag TVar1;
  Unit *unit;
  undefined1 local_80 [8];
  Attribute attr;
  _Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false> local_28;
  
  this_00 = &this->lines;
  if ((this->lines)._M_t.
      super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
      .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl == (LineInfo *)0x0) {
    root((DIE *)&attr.formp,this);
    TVar1 = DIE::tag((DIE *)&attr.formp);
    if ((TVar1 == DW_TAG_partial_unit) ||
       (TVar1 = DIE::tag((DIE *)&attr.formp), TVar1 == DW_TAG_compile_unit)) {
      DIE::attribute((Attribute *)local_80,(DIE *)&attr.formp,DW_AT_stmt_list,false);
      if (attr.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        offset = this->dwarf;
        unit = (Unit *)DIE::Attribute::operator_cast_to_long((Attribute *)local_80);
        Info::linesAt((Info *)&stack0xffffffffffffffd8,(intmax_t)offset,unit);
        __p._M_t.
        super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
        .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl =
             (__uniq_ptr_data<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>,_true,_true>
              )(__uniq_ptr_data<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>,_true,_true>
                )local_28._M_head_impl;
        local_28._M_head_impl = (LineInfo *)0x0;
        std::__uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
        ::reset((__uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                 *)this_00,
                (pointer)__p._M_t.
                         super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
                         .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl);
        std::unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
        ~unique_ptr((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                     *)&stack0xffffffffffffffd8);
      }
      DIE::~DIE((DIE *)local_80);
    }
    DIE::~DIE((DIE *)&attr.formp);
    return this_00;
  }
  return this_00;
}

Assistant:

const std::unique_ptr<LineInfo> &
Unit::getLines()
{
    if (lines != nullptr)
        return lines;

    const auto &r = root();
    if (r.tag() != DW_TAG_partial_unit && r.tag() != DW_TAG_compile_unit)
        return lines;

    auto attr = r.attribute(DW_AT_stmt_list);
    if (!attr.valid())
        return lines;

    lines = dwarf->linesAt(intmax_t(attr), *this);
    return lines;
}